

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet-chatd.c
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int __fd;
  int iVar2;
  long lVar3;
  int *piVar4;
  char *pcVar5;
  telnet_t *ptVar6;
  ssize_t sVar7;
  pollfd local_448;
  pollfd pfd [65];
  socklen_t addrlen;
  sockaddr_in addr;
  int i;
  int rs;
  int client_sock;
  int listen_sock;
  short listen_port;
  char buffer [512];
  char **argv_local;
  int argc_local;
  
  buffer._504_8_ = argv;
  if (argc == 2) {
    memset(&local_448,0,0x208);
    memset(users,0,0x4800);
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
    for (; addr.sin_zero._0_4_ != 0x40; addr.sin_zero._0_4_ = addr.sin_zero._0_4_ + 1) {
      users[(int)addr.sin_zero._0_4_].sock = -1;
    }
    lVar3 = strtol(*(char **)(buffer._504_8_ + 8),(char **)0x0,10);
    __fd = socket(2,1,0);
    pFVar1 = _stderr;
    if (__fd == -1) {
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      fprintf(pFVar1,"socket() failed: %s\n",pcVar5);
    }
    else {
      addr.sin_zero[4] = '\x01';
      addr.sin_zero[5] = '\0';
      addr.sin_zero[6] = '\0';
      addr.sin_zero[7] = '\0';
      setsockopt(__fd,1,2,addr.sin_zero + 4,4);
      memset(&pfd[0x40].events,0,0x10);
      pfd[0x40].events = 2;
      pfd[0x40].revents = htons((uint16_t)lVar3);
      iVar2 = bind(__fd,(sockaddr *)&pfd[0x40].events,0x10);
      pFVar1 = _stderr;
      if (iVar2 == -1) {
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"bind() failed: %s\n",pcVar5);
        close(__fd);
      }
      else {
        iVar2 = listen(__fd,5);
        pFVar1 = _stderr;
        if (iVar2 != -1) {
          printf("LISTENING ON PORT %d\n",(ulong)(uint)(int)(short)(uint16_t)lVar3);
          pfd[0x3f].events = 1;
          pfd[0x3f].fd = __fd;
          while( true ) {
            addr.sin_zero[0] = '\0';
            addr.sin_zero[1] = '\0';
            addr.sin_zero[2] = '\0';
            addr.sin_zero[3] = '\0';
            for (; addr.sin_zero._0_4_ != 0x40; addr.sin_zero._0_4_ = addr.sin_zero._0_4_ + 1) {
              if (users[(int)addr.sin_zero._0_4_].sock == -1) {
                (&local_448)[(int)addr.sin_zero._0_4_].fd = -1;
                pfd[(long)(int)addr.sin_zero._0_4_ + -1].events = 0;
              }
              else {
                (&local_448)[(int)addr.sin_zero._0_4_].fd = users[(int)addr.sin_zero._0_4_].sock;
                pfd[(long)(int)addr.sin_zero._0_4_ + -1].events = 1;
              }
            }
            iVar2 = poll(&local_448,0x41,-1);
            addr.sin_zero[4] = (char)iVar2;
            addr.sin_zero[5] = (char)((uint)iVar2 >> 8);
            addr.sin_zero[6] = (char)((uint)iVar2 >> 0x10);
            addr.sin_zero[7] = (char)((uint)iVar2 >> 0x18);
            if ((iVar2 == -1) && (piVar4 = __errno_location(), pFVar1 = _stderr, *piVar4 != 4))
            break;
            if ((pfd[0x3f].revents & 0x19U) != 0) {
              pfd[0x40].fd = 0x10;
              iVar2 = accept(__fd,(sockaddr *)&pfd[0x40].events,(socklen_t *)(pfd + 0x40));
              pFVar1 = _stderr;
              if (iVar2 == -1) {
                piVar4 = __errno_location();
                pcVar5 = strerror(*piVar4);
                fprintf(pFVar1,"accept() failed: %s\n",pcVar5);
                return 1;
              }
              printf("Connection received.\n");
              addr.sin_zero[0] = '\0';
              addr.sin_zero[1] = '\0';
              addr.sin_zero[2] = '\0';
              addr.sin_zero[3] = '\0';
              while ((addr.sin_zero._0_4_ != 0x40 && (users[(int)addr.sin_zero._0_4_].sock != -1)))
              {
                addr.sin_zero._0_4_ = addr.sin_zero._0_4_ + 1;
              }
              if (addr.sin_zero._0_4_ == 0x40) {
                printf("  rejected (too many users)\n");
                _send(iVar2,"Too many users.\r\n",0xe);
                close(iVar2);
              }
              users[(int)addr.sin_zero._0_4_].sock = iVar2;
              ptVar6 = telnet_init(telopts,_event_handler,'\0',users + (int)addr.sin_zero._0_4_);
              users[(int)addr.sin_zero._0_4_].telnet = ptVar6;
              telnet_negotiate(users[(int)addr.sin_zero._0_4_].telnet,0xfb,'V');
              telnet_printf(users[(int)addr.sin_zero._0_4_].telnet,"Enter name: ");
              telnet_negotiate(users[(int)addr.sin_zero._0_4_].telnet,0xfb,'\x01');
            }
            addr.sin_zero[0] = '\0';
            addr.sin_zero[1] = '\0';
            addr.sin_zero[2] = '\0';
            addr.sin_zero[3] = '\0';
            for (; addr.sin_zero._0_4_ != 0x40; addr.sin_zero._0_4_ = addr.sin_zero._0_4_ + 1) {
              if ((users[(int)addr.sin_zero._0_4_].sock != -1) &&
                 ((pfd[(long)(int)addr.sin_zero._0_4_ + -1].revents & 0x19U) != 0)) {
                sVar7 = recv(users[(int)addr.sin_zero._0_4_].sock,&listen_sock,0x200,0);
                addr.sin_zero._4_4_ = SUB84(sVar7,0);
                if ((int)addr.sin_zero._4_4_ < 1) {
                  if (addr.sin_zero._4_4_ == 0) {
                    printf("Connection closed.\n");
                    close(users[(int)addr.sin_zero._0_4_].sock);
                    users[(int)addr.sin_zero._0_4_].sock = -1;
                    if (users[(int)addr.sin_zero._0_4_].name != (char *)0x0) {
                      _message(users[(int)addr.sin_zero._0_4_].name,"** HAS DISCONNECTED **");
                      free(users[(int)addr.sin_zero._0_4_].name);
                      users[(int)addr.sin_zero._0_4_].name = (char *)0x0;
                    }
                    telnet_free(users[(int)addr.sin_zero._0_4_].telnet);
                  }
                  else {
                    piVar4 = __errno_location();
                    pFVar1 = _stderr;
                    if (*piVar4 != 4) {
                      piVar4 = __errno_location();
                      pcVar5 = strerror(*piVar4);
                      fprintf(pFVar1,"recv(client) failed: %s\n",pcVar5);
                      exit(1);
                    }
                  }
                }
                else {
                  telnet_recv(users[(int)addr.sin_zero._0_4_].telnet,(char *)&listen_sock,
                              (long)(int)addr.sin_zero._4_4_);
                }
              }
            }
          }
          piVar4 = __errno_location();
          pcVar5 = strerror(*piVar4);
          fprintf(pFVar1,"poll() failed: %s\n",pcVar5);
          close(__fd);
          return 1;
        }
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        fprintf(pFVar1,"listen() failed: %s\n",pcVar5);
        close(__fd);
      }
    }
  }
  else {
    fprintf(_stderr,"Usage:\n ./telnet-chatd <port>\n");
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	char buffer[512];
	short listen_port;
	SOCKET listen_sock;
	SOCKET client_sock;
	int rs;
	int i;
	struct sockaddr_in addr;
	socklen_t addrlen;
	struct pollfd pfd[MAX_USERS + 1];

	/* initialize Winsock */
#if defined(_WIN32)
	WSADATA wsd;
	WSAStartup(MAKEWORD(2, 2), &wsd);
#endif

	/* check usage */
	if (argc != 2) {
		fprintf(stderr, "Usage:\n ./telnet-chatd <port>\n");
		return 1;
	}

	/* initialize data structures */
	memset(&pfd, 0, sizeof(pfd));
	memset(users, 0, sizeof(users));
	for (i = 0; i != MAX_USERS; ++i)
		users[i].sock = -1;

	/* parse listening port */
	listen_port = (short)strtol(argv[1], 0, 10);

	/* create listening socket */
	if ((listen_sock = socket(AF_INET, SOCK_STREAM, 0)) == -1) {
		fprintf(stderr, "socket() failed: %s\n", strerror(errno));
		return 1;
	}

	/* reuse address option */
	rs = 1;
	setsockopt(listen_sock, SOL_SOCKET, SO_REUSEADDR, (char*)&rs, sizeof(rs));

	/* bind to listening addr/port */
	memset(&addr, 0, sizeof(addr));
	addr.sin_family = AF_INET;
	addr.sin_addr.s_addr = INADDR_ANY;
	addr.sin_port = htons(listen_port);
	if (bind(listen_sock, (struct sockaddr *)&addr, sizeof(addr)) == -1) {
		fprintf(stderr, "bind() failed: %s\n", strerror(errno));
		close(listen_sock);
		return 1;
	}

	/* listen for clients */
	if (listen(listen_sock, 5) == -1) {
		fprintf(stderr, "listen() failed: %s\n", strerror(errno));
		close(listen_sock);
		return 1;
	}

	printf("LISTENING ON PORT %d\n", listen_port);

	/* initialize listening descriptors */
	pfd[MAX_USERS].fd = listen_sock;
	pfd[MAX_USERS].events = POLLIN;

	/* loop for ever */
	for (;;) {
		/* prepare for poll */
		for (i = 0; i != MAX_USERS; ++i) {
			if (users[i].sock != -1) {
				pfd[i].fd = users[i].sock;
				pfd[i].events = POLLIN;
			} else {
				pfd[i].fd = -1;
				pfd[i].events = 0;
			}
		}

		/* poll */
		rs = poll(pfd, MAX_USERS + 1, -1);
		if (rs == -1 && errno != EINTR) {
			fprintf(stderr, "poll() failed: %s\n", strerror(errno));
			close(listen_sock);
			return 1;
		}

		/* new connection */
		if (pfd[MAX_USERS].revents & (POLLIN | POLLERR | POLLHUP)) {
			/* acept the sock */
			addrlen = sizeof(addr);
			if ((client_sock = accept(listen_sock, (struct sockaddr *)&addr,
					&addrlen)) == -1) {
				fprintf(stderr, "accept() failed: %s\n", strerror(errno));
				return 1;
			}

			printf("Connection received.\n");

			/* find a free user */
			for (i = 0; i != MAX_USERS; ++i)
				if (users[i].sock == -1)
					break;
			if (i == MAX_USERS) {
				printf("  rejected (too many users)\n");
				_send(client_sock, "Too many users.\r\n", 14);
				close(client_sock);
			}

			/* init, welcome */
			users[i].sock = client_sock;
			users[i].telnet = telnet_init(telopts, _event_handler, 0,
					&users[i]);
			telnet_negotiate(users[i].telnet, TELNET_WILL,
					TELNET_TELOPT_COMPRESS2);
			telnet_printf(users[i].telnet, "Enter name: ");

			telnet_negotiate(users[i].telnet, TELNET_WILL, TELNET_TELOPT_ECHO);
		}

		/* read from client */
		for (i = 0; i != MAX_USERS; ++i) {
			/* skip users that aren't actually connected */
			if (users[i].sock == -1)
				continue;

			if (pfd[i].revents & (POLLIN | POLLERR | POLLHUP)) {
				if ((rs = recv(users[i].sock, buffer, sizeof(buffer), 0)) > 0) {
					telnet_recv(users[i].telnet, buffer, rs);
				} else if (rs == 0) {
					printf("Connection closed.\n");
					close(users[i].sock);
					users[i].sock = -1;
					if (users[i].name != 0) {
						_message(users[i].name, "** HAS DISCONNECTED **");
						free(users[i].name);
						users[i].name = 0;
					}
					telnet_free(users[i].telnet);
				} else if (errno != EINTR) {
					fprintf(stderr, "recv(client) failed: %s\n",
							strerror(errno));
					exit(1);
				}
			}
		}
	}

	/* not that we can reach this, but GCC will cry if it's not here */
	return 0;
}